

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

void worker(void *arg)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  
  while( true ) {
    uv_mutex_lock(&mutex);
    while (pvVar3 = wq[0], (void **)wq[0] == wq) {
      idle_threads = idle_threads + 1;
      uv_cond_wait(&cond,&mutex);
      idle_threads = idle_threads - 1;
    }
    if ((void **)wq[0] == exit_message) {
      uv_cond_signal(&cond);
    }
    else {
      lVar1 = *wq[0];
      **(long **)((long)wq[0] + 8) = lVar1;
      *(undefined8 *)(lVar1 + 8) = *(undefined8 *)((long)pvVar3 + 8);
      *(void **)pvVar3 = pvVar3;
      *(void **)((long)pvVar3 + 8) = pvVar3;
    }
    uv_mutex_unlock(&mutex);
    if ((void **)pvVar3 == exit_message) break;
    (**(code **)((long)pvVar3 + -0x18))((long)pvVar3 + -0x18);
    uv_mutex_lock((uv_mutex_t *)(*(long *)((long)pvVar3 + -8) + 0x88));
    *(undefined8 *)((long)pvVar3 + -0x18) = 0;
    *(long *)pvVar3 = *(long *)((long)pvVar3 + -8) + 0x78;
    puVar2 = *(undefined8 **)(*(long *)((long)pvVar3 + -8) + 0x80);
    *(undefined8 **)((long)pvVar3 + 8) = puVar2;
    *puVar2 = pvVar3;
    *(void **)(*(long *)((long)pvVar3 + -8) + 0x80) = pvVar3;
    uv_async_send((uv_async_t *)(*(long *)((long)pvVar3 + -8) + 0xb0));
    uv_mutex_unlock((uv_mutex_t *)(*(long *)((long)pvVar3 + -8) + 0x88));
  }
  return;
}

Assistant:

static void worker(void* arg) {
  struct uv__work* w;
  QUEUE* q;

  (void) arg;

  for (;;) {
    uv_mutex_lock(&mutex);

    while (QUEUE_EMPTY(&wq)) {
      idle_threads += 1;
      uv_cond_wait(&cond, &mutex);
      idle_threads -= 1;
    }

    q = QUEUE_HEAD(&wq);

    if (q == &exit_message)
      uv_cond_signal(&cond);
    else {
      QUEUE_REMOVE(q);
      QUEUE_INIT(q);  /* Signal uv_cancel() that the work req is
                             executing. */
    }

    uv_mutex_unlock(&mutex);

    if (q == &exit_message)
      break;

    w = QUEUE_DATA(q, struct uv__work, wq);
    w->work(w);

    uv_mutex_lock(&w->loop->wq_mutex);
    w->work = NULL;  /* Signal uv_cancel() that the work req is done
                        executing. */
    QUEUE_INSERT_TAIL(&w->loop->wq, &w->wq);
    uv_async_send(&w->loop->wq_async);
    uv_mutex_unlock(&w->loop->wq_mutex);
  }
}